

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

void QuestUnserialize(string *serialized,Character *character)

{
  bool bVar1;
  int iVar2;
  reference pbVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  pointer ppVar7;
  element_type *peVar8;
  const_iterator it;
  const_iterator end;
  map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
  *this;
  pair<std::_Rb_tree_const_iterator<Character_QuestState>,_bool> pVar9;
  __enable_if_t<is_constructible<value_type,_pair<short,_shared_ptr<Quest_Context>_>_>::value,_pair<iterator,_bool>_>
  _Var10;
  pair<short,_std::shared_ptr<Quest_Context>_> local_218;
  _Base_ptr local_200;
  __enable_if_t<is_constructible<value_type,_pair<short,_shared_ptr<Quest_Context>_>_>::value,_pair<iterator,_bool>_>
  result;
  Runtime_Error *ex;
  undefined1 local_1b0 [8];
  shared_ptr<Quest_Context> quest_context;
  Quest *quest;
  _Self local_178;
  _Self local_170;
  iterator quest_it;
  string local_148 [32];
  string local_128 [39];
  byte local_101;
  undefined1 local_100 [7];
  bool conversion_needed;
  undefined1 local_e0 [8];
  Character_QuestState state;
  size_t pp2;
  size_t pp1;
  string local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> part;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  Character *pCStack_18;
  bool conversion_warned;
  Character *character_local;
  string *serialized_local;
  
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  pCStack_18 = character;
  character_local = (Character *)serialized;
  util::explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1,';',serialized);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
  part.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&part.field_2 + 8)), bVar1) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_70,(string *)pbVar3);
    lVar4 = std::__cxx11::string::find_first_of((char)local_70,0x2c);
    if (lVar4 != -1) {
      state.quest_progress.field_2._8_8_ = std::__cxx11::string::find_first_of((char)local_70,0x2c);
      Character_QuestState::Character_QuestState((Character_QuestState *)local_e0);
      std::__cxx11::string::substr((ulong)local_100,(ulong)local_70);
      iVar2 = util::to_int((string *)local_100);
      local_e0._0_2_ = (undefined2)iVar2;
      std::__cxx11::string::~string((string *)local_100);
      local_101 = 0;
      if (state.quest_progress.field_2._8_8_ == -1) {
        state.quest_progress.field_2._8_8_ =
             std::__cxx11::string::find_first_of((char)local_70,0x3b);
        if (state.quest_progress.field_2._8_8_ == -1) {
          lVar4 = std::__cxx11::string::length();
          state.quest_progress.field_2._8_8_ = lVar4 + 1;
        }
        std::__cxx11::string::substr((ulong)&quest_it,(ulong)local_70);
        std::__cxx11::string::operator=((string *)&state,(string *)&quest_it);
        std::__cxx11::string::~string((string *)&quest_it);
        std::__cxx11::string::operator=((string *)(state.quest_state.field_2._M_local_buf + 8),"{}")
        ;
        local_101 = 1;
      }
      else {
        std::__cxx11::string::substr((ulong)local_128,(ulong)local_70);
        std::__cxx11::string::operator=((string *)&state,local_128);
        std::__cxx11::string::~string(local_128);
        std::__cxx11::string::substr((ulong)local_148,(ulong)local_70);
        std::__cxx11::string::operator=
                  ((string *)(state.quest_state.field_2._M_local_buf + 8),local_148);
        std::__cxx11::string::~string(local_148);
        uVar5 = std::__cxx11::string::empty();
        if (((uVar5 & 1) == 0) &&
           (pcVar6 = (char *)std::__cxx11::string::operator[]
                                       ((ulong)((long)&state.quest_state.field_2 + 8)),
           *pcVar6 != '{')) {
          local_101 = 1;
          Console::Wrn("State progress counter reset for quest: %i",
                       (ulong)(uint)(int)(short)local_e0._0_2_);
          std::__cxx11::string::operator=
                    ((string *)(state.quest_state.field_2._M_local_buf + 8),"{}");
        }
        else {
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) != 0) {
            local_101 = 1;
          }
        }
      }
      if (((local_101 & 1) != 0) &&
         ((parts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0)) {
        Console::Wrn("Converting quests from old format...");
        parts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      }
      local_170._M_node =
           (_Base_ptr)
           std::
           map<short,_std::shared_ptr<Quest>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest>_>_>_>
           ::find(&pCStack_18->world->quests,(key_type *)local_e0);
      local_178._M_node =
           (_Base_ptr)
           std::
           map<short,_std::shared_ptr<Quest>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest>_>_>_>
           ::end(&pCStack_18->world->quests);
      bVar1 = std::operator==(&local_170,&local_178);
      if (bVar1) {
        Console::Wrn("Quest not found: %i. Marking as inactive.",
                     (ulong)(uint)(int)(short)local_e0._0_2_);
        pVar9 = std::
                set<Character_QuestState,_std::less<Character_QuestState>,_std::allocator<Character_QuestState>_>
                ::insert(&pCStack_18->quests_inactive,(value_type *)local_e0);
        if (((pVar9.second ^ 0xffU) & 1) != 0) {
          Console::Wrn("Duplicate inactive quest record dropped for quest: %i",
                       (ulong)(uint)(int)(short)local_e0._0_2_);
        }
      }
      else {
        ppVar7 = std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Quest>_>_>::
                 operator->(&local_170);
        quest_context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                std::__shared_ptr<Quest,_(__gnu_cxx::_Lock_policy)2>::get
                          (&(ppVar7->second).super___shared_ptr<Quest,_(__gnu_cxx::_Lock_policy)2>);
        std::make_shared<Quest_Context,Character*&,Quest*&>
                  ((Character **)local_1b0,(Quest **)&stack0xffffffffffffffe8);
        peVar8 = std::__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1b0);
        EOPlus::Context::SetState(&peVar8->super_Context,(string *)&state,false);
        peVar8 = std::__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1b0);
        it = std::cbegin<std::__cxx11::string>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&state.quest_state.field_2 + 8));
        end = std::cend<std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&state.quest_state.field_2 + 8));
        Quest_Context::UnserializeProgress(peVar8,it,end);
        this = &pCStack_18->quests;
        std::make_pair<short&,std::shared_ptr<Quest_Context>>
                  (&local_218,(short *)local_e0,(shared_ptr<Quest_Context> *)local_1b0);
        _Var10 = std::
                 map<short,std::shared_ptr<Quest_Context>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Quest_Context>>>>
                 ::insert<std::pair<short,std::shared_ptr<Quest_Context>>>
                           ((map<short,std::shared_ptr<Quest_Context>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Quest_Context>>>>
                             *)this,&local_218);
        local_200 = (_Base_ptr)_Var10.first._M_node;
        result.first._M_node._0_1_ = _Var10.second;
        std::pair<short,_std::shared_ptr<Quest_Context>_>::~pair(&local_218);
        if (((byte)result.first._M_node & 1) == 0) {
          Console::Wrn("Duplicate quest record dropped for quest: %i",
                       (ulong)(uint)(int)(short)local_e0._0_2_);
        }
        std::shared_ptr<Quest_Context>::~shared_ptr((shared_ptr<Quest_Context> *)local_1b0);
      }
      Character_QuestState::~Character_QuestState((Character_QuestState *)local_e0);
    }
    std::__cxx11::string::~string(local_70);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  return;
}

Assistant:

void QuestUnserialize(std::string serialized, Character* character)
{
	bool conversion_warned = false;

	std::vector<std::string> parts = util::explode(';', serialized);

	UTIL_FOREACH(parts, part)
	{
		std::size_t pp1 = part.find_first_of(',');

		if (pp1 == std::string::npos)
			continue;

		std::size_t pp2 = part.find_first_of(',', pp1 + 1);

		Character_QuestState state;
		state.quest_id = util::to_int(part.substr(0, pp1));

		bool conversion_needed = false;

		if (pp2 != std::string::npos)
		{
			state.quest_state = part.substr(pp1 + 1, pp2 - pp1 - 1);
			state.quest_progress = part.substr(pp2 + 1);

			if (!state.quest_progress.empty() && state.quest_progress[0] != '{')
			{
				conversion_needed = true;

				// We could peek at the quest state for a possible matching rule here,
				// but it would greatly complicate the unserialization code.
				Console::Wrn("State progress counter reset for quest: %i", state.quest_id);
				state.quest_progress = "{}";
			}
			else if (state.quest_progress.empty())
			{
				conversion_needed = true;
			}
		}
		else
		{
			pp2 = part.find_first_of(';', pp1 + 1);

			if (pp2 == std::string::npos)
				pp2 = part.length() + 1;

			state.quest_state = part.substr(pp1 + 1, pp2 - pp1 - 1);
			state.quest_progress = "{}";

			conversion_needed = true;
		}

		if (conversion_needed)
		{
			if (!conversion_warned)
			{
				Console::Wrn("Converting quests from old format...");
				conversion_warned = true;
			}

			// Vodka leaves the quest state set to the end of the quest, which
			// means everyone will get stuck in an unfinished state
		}

		auto quest_it = character->world->quests.find(state.quest_id);

		if (quest_it == character->world->quests.end())
		{
			Console::Wrn("Quest not found: %i. Marking as inactive.", state.quest_id);

			// Store it in a non-activate state so we don't have to delete the data
			if (!character->quests_inactive.insert(std::move(state)).second)
				Console::Wrn("Duplicate inactive quest record dropped for quest: %i", state.quest_id);

			continue;
		}

		// WARNING: holds a non-tracked reference to shared_ptr
		Quest* quest = quest_it->second.get();
		auto quest_context(std::make_shared<Quest_Context>(character, quest));

		try
		{
			quest_context->SetState(state.quest_state, false);
			quest_context->UnserializeProgress(UTIL_CRANGE(state.quest_progress));
		}
		catch (EOPlus::Runtime_Error& ex)
		{
			Console::Wrn(ex.what());
			Console::Wrn("Could not resume quest: %i. Marking as inactive.", state.quest_id);

			if (!character->quests_inactive.insert(std::move(state)).second)
				Console::Wrn("Duplicate inactive quest record dropped for quest: %i", state.quest_id);

			continue;
		}

		auto result = character->quests.insert(std::make_pair(state.quest_id, std::move(quest_context)));

		if (!result.second)
		{
			Console::Wrn("Duplicate quest record dropped for quest: %i", state.quest_id);
			continue;
		}
	}
}